

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O3

Qiniu_Error Qiniu_Qetag_mergeBlocks(_Qiniu_Qetag_Context *ctx)

{
  byte *pbVar1;
  Qiniu_Crypto_Result QVar2;
  uint uVar3;
  undefined8 uVar4;
  ushort uVar5;
  ulong uVar6;
  char *pcVar7;
  Qiniu_Error QVar8;
  uchar digest [20];
  uchar auStack_48 [24];
  
  pcVar7 = "ok";
  uVar4 = 200;
  if (ctx->blkUnused < ctx->blkElementCount) {
    uVar3 = (uint)ctx->blkBegin;
    do {
      uVar6 = (ulong)((uVar3 & 0xffff) << 4);
      if (((&ctx->blkArray[0].field_0.field_0x2)[uVar6] & 0x80) == 0) break;
      QVar2 = Qiniu_Digest_Final(*(Qiniu_Digest **)((long)&ctx->blkArray[0].sha1Digest + uVar6),
                                 auStack_48,(size_t *)0x0);
      if (QVar2 != QINIU_CRYPTO_RESULT_OK) {
LAB_0011435e:
        uVar4 = 9999;
        pcVar7 = "openssl internal error";
        goto LAB_0011436a;
      }
      QVar2 = Qiniu_Digest_Update(ctx->sha1Digest,auStack_48,0x14);
      if (QVar2 != QINIU_CRYPTO_RESULT_OK) goto LAB_0011435e;
      pbVar1 = &ctx->blkArray[0].field_0.field_0x2 + uVar6;
      *pbVar1 = *pbVar1 & 0x7f;
      uVar3 = *(int *)&ctx->blkBegin + 1;
      if (ctx->blkElementCount <= (ushort)uVar3) {
        uVar3 = 0;
      }
      ctx->blkBegin = (unsigned_short)uVar3;
      uVar5 = ctx->blkUnused + 1;
      ctx->blkUnused = uVar5;
    } while (uVar5 < ctx->blkElementCount);
    uVar4 = 200;
  }
LAB_0011436a:
  QVar8.message = pcVar7;
  QVar8._0_8_ = uVar4;
  return QVar8;
}

Assistant:

static Qiniu_Error Qiniu_Qetag_mergeBlocks(struct _Qiniu_Qetag_Context * ctx) {
    Qiniu_Error err;
    unsigned char digest[SHA_DIGEST_LENGTH];
    struct _Qiniu_Qetag_Block * blk = NULL;

    while (ctx->blkUnused < ctx->blkElementCount && ctx->blkArray[ctx->blkBegin].done == YES) {
        blk = &ctx->blkArray[ctx->blkBegin];

		if (Qiniu_Digest_Final(blk->sha1Digest, digest, NULL) != QINIU_CRYPTO_RESULT_OK) {
			err.code = 9999;
			err.message = "openssl internal error";
			return err;
		}

		if (Qiniu_Digest_Update(ctx->sha1Digest, digest, sizeof(digest)) != QINIU_CRYPTO_RESULT_OK) {
			err.code = 9999;
			err.message = "openssl internal error";
			return err;
		}

        blk->done = NO;

        ctx->blkBegin += 1;
        if (ctx->blkBegin >= ctx->blkElementCount) {
            ctx->blkBegin = 0;
        }
        ctx->blkUnused += 1;
    } // while

    err.code = 200;
    err.message = "ok";
    return err;
}